

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pal_packing.cpp
# Opt level: O3

void __thiscall
packing::AssignedProtos::assign<unsigned_long_const&>(AssignedProtos *this,unsigned_long *args)

{
  __normal_iterator<std::optional<packing::ProtoPalAttrs>_*,_std::vector<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>_>
  this_00;
  
  this_00 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::optional<packing::ProtoPalAttrs>*,std::vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>>,__gnu_cxx::__ops::_Iter_negate<packing::AssignedProtos::assign<unsigned_long_const&>(unsigned_long_const&)::_lambda(std::optional<packing::ProtoPalAttrs>const&)_1_>>
                      ((this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_start,
                       (this->_assigned).
                       super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish);
  if (this_00._M_current !=
      (this->_assigned).
      super__Vector_base<std::optional<packing::ProtoPalAttrs>,_std::allocator<std::optional<packing::ProtoPalAttrs>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::_Optional_payload_base<packing::ProtoPalAttrs>::_M_reset
              ((_Optional_payload_base<packing::ProtoPalAttrs> *)this_00._M_current);
    ((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
    super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
    super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.protoPalIndex = *args;
    *(undefined8 *)
     &((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
      super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
      super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
      super__Bvector_base<std::allocator<bool>_>._M_impl = 0;
    *(undefined4 *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload + 0x10) = 0;
    (((_Bit_iterator *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 0x10))->super__Bit_iterator_base)._M_p =
         (_Bit_type *)0x0;
    *(undefined4 *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload + 0x20) = 0;
    *(_Bit_pointer *)
     ((long)&((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>).
             _M_payload.super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
             super__Optional_payload_base<packing::ProtoPalAttrs>._M_payload._M_value.bannedPages.
             super__Bvector_base<std::allocator<bool>_> + 0x20) = (_Bit_pointer)0x0;
    ((this_00._M_current)->super__Optional_base<packing::ProtoPalAttrs,_false,_false>)._M_payload.
    super__Optional_payload<packing::ProtoPalAttrs,_true,_false,_false>.
    super__Optional_payload_base<packing::ProtoPalAttrs>._M_engaged = true;
    return;
  }
  std::
  vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>
  ::emplace_back<unsigned_long_const&>
            ((vector<std::optional<packing::ProtoPalAttrs>,std::allocator<std::optional<packing::ProtoPalAttrs>>>
              *)this,args);
  return;
}

Assistant:

void assign(Ts &&...args) {
		auto freeSlot = std::find_if_not(
		    _assigned.begin(), _assigned.end(),
		    [](std::optional<ProtoPalAttrs> const &slot) { return slot.has_value(); });

		if (freeSlot == _assigned.end()) { // We are full, use a new slot
			_assigned.emplace_back(std::forward<Ts>(args)...);
		} else { // Reuse a free slot
			freeSlot->emplace(std::forward<Ts>(args)...);
		}
	}